

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O3

void __thiscall
libtorrent::anon_unknown_5::bits_shift_left(anon_unknown_5 *this,span<unsigned_int> number,int n)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = (int)number.m_len;
  iVar1 = iVar7 + 0x1f;
  if (-1 < iVar7) {
    iVar1 = iVar7;
  }
  uVar3 = iVar1 >> 5;
  iVar8 = (int)number.m_ptr;
  iVar1 = iVar8 - uVar3;
  if (iVar1 != 0 && (int)uVar3 <= iVar8) {
    if (0x1f < iVar7) {
      memmove(this,this + (ulong)uVar3 * 4,(long)iVar1 * 4);
      memset(this + (long)iVar1 * 4,0,(ulong)uVar3 << 2);
      iVar7 = iVar7 + uVar3 * -0x20;
    }
    if (0 < iVar7) {
      uVar3 = *(uint *)this;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint *)this = uVar4;
      uVar3 = iVar8 - 1;
      bVar2 = (byte)iVar7;
      if (1 < iVar8) {
        uVar6 = 0;
        do {
          uVar5 = uVar4 << (bVar2 & 0x1f);
          uVar4 = *(uint *)(this + uVar6 * 4 + 4);
          uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          *(uint *)(this + uVar6 * 4 + 4) = uVar4;
          uVar5 = uVar4 >> (0x20 - bVar2 & 0x1f) | uVar5;
          *(uint *)(this + uVar6 * 4) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      uVar4 = *(int *)(this + (long)(int)uVar3 * 4) << (bVar2 & 0x1f);
      *(uint *)(this + (long)(int)uVar3 * 4) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    return;
  }
  memset(this,0,(long)number.m_ptr << 2);
  return;
}

Assistant:

void bits_shift_left(span<std::uint32_t> const number, int n) noexcept
	{
		TORRENT_ASSERT(n >= 0);
		int const num_words = n / 32;
		int const number_size = int(number.size());
		if (num_words >= number_size)
		{
			std::memset(number.data(), 0, std::size_t(number.size() * 4));
			return;
		}

		if (num_words > 0)
		{
			std::memmove(number.data(), number.data() + num_words
				, std::size_t(number_size - num_words) * sizeof(std::uint32_t));
			std::memset(number.data() + (number_size - num_words)
				, 0, std::size_t(num_words) * sizeof(std::uint32_t));
			n -= num_words * 32;
		}
		if (n > 0)
		{
			// keep in mind that the uint32_t are stored in network
			// byte order, so they have to be byteswapped before
			// applying the shift operations, and then byteswapped
			// back again.
			number[0] = aux::network_to_host(number[0]);
			for (int i = 0; i < number_size - 1; ++i)
			{
				number[i] <<= n;
				number[i + 1] = aux::network_to_host(number[i + 1]);
				number[i] |= number[i + 1] >> (32 - n);
				number[i] = aux::host_to_network(number[i]);
			}
			number[number_size - 1] <<= n;
			number[number_size - 1] = aux::host_to_network(number[number_size - 1]);
		}
	}